

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatementReader.cpp
# Opt level: O2

void __thiscall
Js::
StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
::Create(StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
         *this,byte *byteCodeStart,uint startOffset,SmallSpanSequence *statementMap,
        List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *fullstatementMap)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  byte *pbVar5;
  StatementMap *pSVar6;
  Type *pTVar7;
  byte *pbVar8;
  StatementData local_28;
  StatementData data;
  
  this->m_startLocation = byteCodeStart;
  pbVar8 = byteCodeStart + startOffset;
  this->m_statementMap = statementMap;
  this->m_fullstatementMap = fullstatementMap;
  if (((statementMap == (SmallSpanSequence *)0x0) ||
      (statementMap->pStatementBuffer == (GrowingUint32HeapArray *)0x0)) ||
     (statementMap->pStatementBuffer->count == 0)) {
    if ((fullstatementMap !=
         (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0) &&
       ((fullstatementMap->
        super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>).
        count != 0)) {
      this->m_statementIndex = 0;
      this->m_startOfStatement = true;
      pSVar6 = FunctionBody::
               GetNextNonSubexpressionStatementMap<JsUtil::List<Js::FunctionBody::StatementMap*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>>
                         (fullstatementMap,&this->m_statementIndex);
      if (pSVar6 != (StatementMap *)0x0) {
        pbVar5 = this->m_startLocation;
        pTVar7 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this->m_fullstatementMap,this->m_statementIndex);
        pbVar5 = pbVar5 + (pTVar7->ptr->byteCodeSpan).begin;
        this->m_nextStatementBoundary = pbVar5;
        while (pbVar5 < pbVar8) {
          MoveNextStatementBoundary(this);
          pbVar5 = this->m_nextStatementBoundary;
        }
        return;
      }
    }
    this->m_nextStatementBoundary = pbVar8 + -1;
  }
  else {
    SmallSpanSequence::Reset(statementMap,&this->m_statementMapIter);
    this->m_statementIndex = 0;
    this->m_startOfStatement = true;
    local_28.sourceBegin = 0;
    local_28.bytecodeBegin = 0;
    BVar3 = SmallSpanSequence::Seek(this->m_statementMap,0,&local_28);
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/StatementReader.cpp"
                                  ,0x28,"(0)","FALSE");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    pbVar5 = this->m_startLocation + local_28.bytecodeBegin;
    this->m_nextStatementBoundary = pbVar5;
    while (pbVar5 < pbVar8) {
      MoveNextStatementBoundary(this);
      pbVar5 = this->m_nextStatementBoundary;
    }
  }
  return;
}

Assistant:

void StatementReader<TStatementMapList>::Create(
        _In_ const byte * byteCodeStart,
        uint startOffset,
        Js::SmallSpanSequence * statementMap,
        TStatementMapList* fullstatementMap)
    {
        m_startLocation = byteCodeStart;

        const byte * currentLocation = m_startLocation + startOffset;

        m_statementMap = statementMap;
        m_fullstatementMap = fullstatementMap;

        if (m_statementMap && m_statementMap->Count())
        {
            m_statementMap->Reset(m_statementMapIter);

            m_statementIndex = 0;
            m_startOfStatement = true;

            StatementData data;
            if (!m_statementMap->Seek(m_statementIndex, data))
            {
                Assert(FALSE);
            }

            m_nextStatementBoundary = m_startLocation + data.bytecodeBegin;

            // If we starting in the middle of the function (e.g., loop body), find out where the next statement is.
            while (m_nextStatementBoundary < currentLocation)
            {
                this->MoveNextStatementBoundary();
            }
        }
        else if (m_fullstatementMap && m_fullstatementMap->Count())
        {
            m_statementIndex = 0;
            m_startOfStatement = true;
            FunctionBody::StatementMap *nextMap = Js::FunctionBody::GetNextNonSubexpressionStatementMap(m_fullstatementMap, m_statementIndex);
            if (!nextMap)
            {
                // set to a location that will never match
                m_nextStatementBoundary = currentLocation - 1;
            }
            else
            {
                m_nextStatementBoundary = m_startLocation + m_fullstatementMap->Item(m_statementIndex)->byteCodeSpan.begin;

                // If we starting in the middle of the function (e.g., loop body), find out where the next statement is.
                while (m_nextStatementBoundary < currentLocation)
                {
                    this->MoveNextStatementBoundary();
                }
            }
        }
        else
        {
            // set to a location that will never match
            m_nextStatementBoundary = currentLocation - 1;
        }
    }